

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O2

Vec_Ptr_t * Abc_NtkComputeSupportsNaive(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *in_RAX;
  Vec_Ptr_t *p;
  void *pvVar1;
  uint uVar2;
  Vec_Ptr_t *in_RSI;
  int i;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *local_38;
  
  for (pAVar3 = (Abc_Obj_t *)0x0; (long)pAVar3 < (long)pNtk->vCis->nSize;
      pAVar3 = (Abc_Obj_t *)((long)&pAVar3->pNtk + 1)) {
    in_RSI = (Vec_Ptr_t *)((ulong)pAVar3 & 0xffffffff);
    in_RAX = Abc_NtkCi(pNtk,(int)pAVar3);
    in_RAX->pNext = pAVar3;
  }
  local_38 = in_RAX;
  p = Vec_PtrAlloc(pNtk->vCos->nSize);
  for (uVar2 = 0; (int)uVar2 < pNtk->vCos->nSize; uVar2 = uVar2 + 1) {
    in_RSI = (Vec_Ptr_t *)(ulong)uVar2;
    local_38 = Abc_NtkCo(pNtk,uVar2);
    if ((*(uint *)((long)local_38->pNtk->vObjs->pArray[*(local_38->vFanins).pArray] + 0x14) & 0xf)
        == 7) {
      in_RSI = Abc_NtkNodeSupport(pNtk,&local_38,1);
      i = 0;
      while( true ) {
        if (in_RSI->nSize <= i) break;
        pvVar1 = Vec_PtrEntry(in_RSI,i);
        Vec_IntWriteEntry((Vec_Int_t *)in_RSI,i,*(int *)((long)pvVar1 + 8));
        i = i + 1;
      }
      qsort(in_RSI->pArray,(long)in_RSI->nSize,4,Vec_IntSortCompare1);
      Vec_IntPush((Vec_Int_t *)in_RSI,uVar2);
      Vec_PtrPush(p,in_RSI);
    }
  }
  for (uVar2 = 0; (int)uVar2 < pNtk->vCis->nSize; uVar2 = uVar2 + 1) {
    in_RSI = (Vec_Ptr_t *)(ulong)uVar2;
    local_38 = Abc_NtkCi(pNtk,uVar2);
    local_38->pNext = (Abc_Obj_t *)0x0;
  }
  Vec_VecSort((Vec_Vec_t *)p,(int)in_RSI);
  return p;
}

Assistant:

Vec_Ptr_t * Abc_NtkComputeSupportsNaive( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vSupp, * vSupports;
    Vec_Int_t * vSuppI;
    Abc_Obj_t * pObj, * pTemp;
    int i, k;
    // set the PI numbers
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pNext = (Abc_Obj_t *)(ABC_PTRINT_T)i;
    // save the CI numbers
    vSupports = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        if ( !Abc_ObjIsNode(Abc_ObjFanin0(pObj)) )
            continue;
        vSupp = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        vSuppI = (Vec_Int_t *)vSupp;
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pTemp, k )
            Vec_IntWriteEntry( vSuppI, k, (int)(ABC_PTRINT_T)pTemp->pNext );
        Vec_IntSort( vSuppI, 0 );
        // append the number of this output
        Vec_IntPush( vSuppI, i );
        // save the support in the vector
        Vec_PtrPush( vSupports, vSuppI );
    }
    // clean the CI numbers
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pNext = NULL;
    // sort supports by size
    Vec_VecSort( (Vec_Vec_t *)vSupports, 1 );
/*
    Vec_PtrForEachEntry( Vec_Int_t *, vSupports, vSuppI, i )
        printf( "%d ", Vec_IntSize(vSuppI) );
    printf( "\n" );
*/
    return vSupports;
}